

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86.cpp
# Opt level: O1

int ncnn::lstm(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
              Mat *weight_hr,Mat *hidden_state,Mat *cell_state,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint _h;
  void *pvVar8;
  size_t sVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  ulong uVar12;
  int *piVar13;
  ulong uVar14;
  long lVar15;
  void *pvVar16;
  ulong uVar17;
  uint uVar18;
  float *pfVar19;
  float *pfVar20;
  int iVar21;
  long lVar22;
  void *pvVar23;
  long lVar24;
  ulong uVar25;
  float *pfVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar33 [32];
  undefined1 auVar35 [64];
  float fVar43;
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar68 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined4 uVar120;
  undefined1 auVar119 [16];
  undefined1 in_ZMM12 [64];
  undefined1 auVar121 [16];
  Mat local_1b8;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [16];
  Mat *local_140;
  Mat *local_138;
  Mat *local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  void *local_110;
  undefined1 local_108 [32];
  Allocator *local_e8;
  int iStack_e0;
  int iStack_dc;
  undefined8 uStack_d8;
  int local_d0;
  size_t local_c8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  ulong local_98;
  long local_90;
  ulong local_88;
  Mat *local_80;
  Mat *local_78;
  ulong local_70;
  long local_68;
  void *local_60;
  undefined1 local_58 [32];
  undefined1 auVar34 [32];
  
  uVar5 = bottom_blob->w;
  uVar6 = bottom_blob->h;
  uVar7 = top_blob->w;
  _h = cell_state->w;
  local_1b8.cstep = 0;
  local_1b8.data = (void *)0x0;
  local_1b8.refcount._0_4_ = 0;
  local_1b8.refcount._4_4_ = 0;
  local_1b8.elemsize = 0;
  local_1b8.elempack = 0;
  local_1b8.allocator = (Allocator *)0x0;
  local_1b8.dims = 0;
  local_1b8.w = 0;
  local_1b8.h = 0;
  local_1b8.d = 0;
  local_1b8.c = 0;
  local_138 = bottom_blob;
  local_130 = weight_xc;
  local_78 = top_blob;
  Mat::create(&local_1b8,4,_h,4,opt->workspace_allocator);
  iVar21 = -100;
  if ((local_1b8.data == (void *)0x0) || ((long)local_1b8.c * local_1b8.cstep == 0))
  goto LAB_0039b936;
  uVar14 = (ulong)(int)_h;
  local_c8 = 0;
  local_108._0_8_ = (void *)0x0;
  local_108._8_4_ = 0;
  local_108._12_4_ = 0;
  local_108._16_12_ = SUB1612((undefined1  [16])0x0,4);
  local_e8 = (Allocator *)0x0;
  iStack_e0 = 0;
  iStack_dc = 0;
  uStack_d8._0_4_ = 0;
  uStack_d8._4_4_ = 0;
  local_d0 = 0;
  local_140 = bias_c;
  if (uVar7 == _h) {
LAB_0039abeb:
    if ((int)uVar6 < 1) {
      iVar21 = 0;
    }
    else {
      local_118 = (ulong)(uint)((int)_h >> 1);
      local_120 = uVar14 & 0xfffffffffffffffe;
      local_88 = (ulong)(uint)((int)_h >> 2);
      local_128 = uVar14 & 0xfffffffffffffffc;
      local_98 = (ulong)(_h + 7 & 0xfffffff8);
      auVar88._8_8_ = 0;
      auVar88._0_8_ = (ulong)_h - 1;
      auVar88 = vpshufd_avx(auVar88,0x44);
      local_58._16_16_ = auVar88;
      local_58._0_16_ = auVar88;
      local_90 = local_88 * 4;
      uVar25 = 0;
      local_80 = weight_hc;
      do {
        uVar18 = ~(uint)uVar25 + uVar6;
        if (reverse == 0) {
          uVar18 = (uint)uVar25;
        }
        lVar15 = (long)(int)uVar18;
        if (0 < (int)local_118) {
          uVar17 = 0;
          do {
            pfVar19 = (float *)((long)local_130->w * uVar17 * local_130->elemsize +
                               (long)local_130->data);
            pfVar20 = (float *)(local_138->w * lVar15 * local_138->elemsize + (long)local_138->data)
            ;
            pfVar26 = (float *)((long)local_140->data + uVar17 * 0x20);
            fVar27 = *pfVar26;
            fVar36 = pfVar26[1];
            fVar37 = pfVar26[2];
            fVar38 = pfVar26[3];
            fVar39 = pfVar26[4];
            fVar40 = pfVar26[5];
            fVar41 = pfVar26[6];
            fVar42 = pfVar26[7];
            if ((int)uVar5 < 4) {
              fVar61 = 0.0;
              fVar69 = 0.0;
              fVar70 = 0.0;
              fVar71 = 0.0;
              fVar72 = 0.0;
              fVar73 = 0.0;
              fVar74 = 0.0;
              fVar75 = 0.0;
              auVar85 = ZEXT864(0);
              fVar43 = 0.0;
              fVar54 = 0.0;
              fVar55 = 0.0;
              fVar56 = 0.0;
              fVar57 = 0.0;
              fVar58 = 0.0;
              fVar59 = 0.0;
              fVar60 = 0.0;
              uVar18 = 0;
            }
            else {
              fVar43 = 0.0;
              fVar54 = 0.0;
              fVar55 = 0.0;
              fVar56 = 0.0;
              fVar57 = 0.0;
              fVar58 = 0.0;
              fVar59 = 0.0;
              fVar60 = 0.0;
              iVar21 = 3;
              auVar85 = ZEXT864(0);
              fVar61 = 0.0;
              fVar69 = 0.0;
              fVar70 = 0.0;
              fVar71 = 0.0;
              fVar72 = 0.0;
              fVar73 = 0.0;
              fVar74 = 0.0;
              fVar75 = 0.0;
              do {
                fVar1 = *pfVar20;
                fVar2 = pfVar20[1];
                fVar3 = pfVar20[2];
                fVar4 = pfVar20[3];
                fVar27 = fVar1 * *pfVar19 + fVar27;
                fVar36 = fVar1 * pfVar19[1] + fVar36;
                fVar37 = fVar1 * pfVar19[2] + fVar37;
                fVar38 = fVar1 * pfVar19[3] + fVar38;
                fVar39 = fVar1 * pfVar19[4] + fVar39;
                fVar40 = fVar1 * pfVar19[5] + fVar40;
                fVar41 = fVar1 * pfVar19[6] + fVar41;
                fVar42 = fVar1 + fVar42;
                fVar43 = fVar2 * pfVar19[8] + fVar43;
                fVar54 = fVar2 * pfVar19[9] + fVar54;
                fVar55 = fVar2 * pfVar19[10] + fVar55;
                fVar56 = fVar2 * pfVar19[0xb] + fVar56;
                fVar57 = fVar2 * pfVar19[0xc] + fVar57;
                fVar58 = fVar2 * pfVar19[0xd] + fVar58;
                fVar59 = fVar2 * pfVar19[0xe] + fVar59;
                fVar60 = fVar2 + fVar60;
                auVar85 = ZEXT3264(CONCAT428(fVar1 + auVar85._28_4_,
                                             CONCAT424(fVar3 * pfVar19[0x16] + auVar85._24_4_,
                                                       CONCAT420(fVar3 * pfVar19[0x15] +
                                                                 auVar85._20_4_,
                                                                 CONCAT416(fVar3 * pfVar19[0x14] +
                                                                           auVar85._16_4_,
                                                                           CONCAT412(fVar3 * pfVar19
                                                  [0x13] + auVar85._12_4_,
                                                  CONCAT48(fVar3 * pfVar19[0x12] + auVar85._8_4_,
                                                           CONCAT44(fVar3 * pfVar19[0x11] +
                                                                    auVar85._4_4_,
                                                                    fVar3 * pfVar19[0x10] +
                                                                    auVar85._0_4_))))))));
                fVar61 = fVar4 * pfVar19[0x18] + fVar61;
                fVar69 = fVar4 * pfVar19[0x19] + fVar69;
                fVar70 = fVar4 * pfVar19[0x1a] + fVar70;
                fVar71 = fVar4 * pfVar19[0x1b] + fVar71;
                fVar72 = fVar4 * pfVar19[0x1c] + fVar72;
                fVar73 = fVar4 * pfVar19[0x1d] + fVar73;
                fVar74 = fVar4 * pfVar19[0x1e] + fVar74;
                fVar75 = fVar1 + fVar75;
                pfVar20 = pfVar20 + 4;
                pfVar19 = pfVar19 + 0x20;
                iVar21 = iVar21 + 4;
                uVar18 = uVar5 & 0xfffffffc;
              } while (iVar21 < (int)uVar5);
            }
            auVar84 = auVar85._0_32_;
            if ((int)uVar18 < (int)uVar5) {
              lVar22 = 0;
              do {
                fVar1 = pfVar20[lVar22];
                fVar27 = fVar1 * *pfVar19 + fVar27;
                fVar36 = fVar1 * pfVar19[1] + fVar36;
                fVar37 = fVar1 * pfVar19[2] + fVar37;
                fVar38 = fVar1 * pfVar19[3] + fVar38;
                fVar39 = fVar1 * pfVar19[4] + fVar39;
                fVar40 = fVar1 * pfVar19[5] + fVar40;
                fVar41 = fVar1 * pfVar19[6] + fVar41;
                fVar42 = fVar1 + fVar42;
                pfVar19 = pfVar19 + 8;
                lVar22 = lVar22 + 1;
              } while (uVar5 - uVar18 != (int)lVar22);
            }
            pfVar19 = (float *)((long)local_80->w * uVar17 * local_80->elemsize +
                               (long)local_80->data);
            pfVar26 = (float *)hidden_state->data;
            uVar18 = 0;
            if (3 < (int)uVar7) {
              iVar21 = 3;
              do {
                fVar1 = *pfVar26;
                fVar2 = pfVar26[1];
                fVar3 = pfVar26[2];
                fVar4 = pfVar26[3];
                fVar27 = fVar1 * *pfVar19 + fVar27;
                fVar36 = fVar1 * pfVar19[1] + fVar36;
                fVar37 = fVar1 * pfVar19[2] + fVar37;
                fVar38 = fVar1 * pfVar19[3] + fVar38;
                fVar39 = fVar1 * pfVar19[4] + fVar39;
                fVar40 = fVar1 * pfVar19[5] + fVar40;
                fVar41 = fVar1 * pfVar19[6] + fVar41;
                fVar42 = fVar1 + fVar42;
                fVar43 = fVar2 * pfVar19[8] + fVar43;
                fVar54 = fVar2 * pfVar19[9] + fVar54;
                fVar55 = fVar2 * pfVar19[10] + fVar55;
                fVar56 = fVar2 * pfVar19[0xb] + fVar56;
                fVar57 = fVar2 * pfVar19[0xc] + fVar57;
                fVar58 = fVar2 * pfVar19[0xd] + fVar58;
                fVar59 = fVar2 * pfVar19[0xe] + fVar59;
                fVar60 = fVar2 + fVar60;
                auVar84._0_4_ = fVar3 * pfVar19[0x10] + auVar85._0_4_;
                auVar84._4_4_ = fVar3 * pfVar19[0x11] + auVar85._4_4_;
                auVar84._8_4_ = fVar3 * pfVar19[0x12] + auVar85._8_4_;
                auVar84._12_4_ = fVar3 * pfVar19[0x13] + auVar85._12_4_;
                auVar84._16_4_ = fVar3 * pfVar19[0x14] + auVar85._16_4_;
                auVar84._20_4_ = fVar3 * pfVar19[0x15] + auVar85._20_4_;
                auVar84._24_4_ = fVar3 * pfVar19[0x16] + auVar85._24_4_;
                auVar84._28_4_ = fVar1 + auVar85._28_4_;
                auVar85 = ZEXT3264(auVar84);
                fVar61 = fVar4 * pfVar19[0x18] + fVar61;
                fVar69 = fVar4 * pfVar19[0x19] + fVar69;
                fVar70 = fVar4 * pfVar19[0x1a] + fVar70;
                fVar71 = fVar4 * pfVar19[0x1b] + fVar71;
                fVar72 = fVar4 * pfVar19[0x1c] + fVar72;
                fVar73 = fVar4 * pfVar19[0x1d] + fVar73;
                fVar74 = fVar4 * pfVar19[0x1e] + fVar74;
                fVar75 = fVar1 + fVar75;
                pfVar26 = pfVar26 + 4;
                pfVar19 = pfVar19 + 0x20;
                iVar21 = iVar21 + 4;
                uVar18 = uVar7 & 0xfffffffc;
              } while (iVar21 < (int)uVar7);
            }
            if ((int)uVar18 < (int)uVar7) {
              lVar22 = 0;
              do {
                fVar1 = pfVar26[lVar22];
                fVar27 = fVar1 * *pfVar19 + fVar27;
                fVar36 = fVar1 * pfVar19[1] + fVar36;
                fVar37 = fVar1 * pfVar19[2] + fVar37;
                fVar38 = fVar1 * pfVar19[3] + fVar38;
                fVar39 = fVar1 * pfVar19[4] + fVar39;
                fVar40 = fVar1 * pfVar19[5] + fVar40;
                fVar41 = fVar1 * pfVar19[6] + fVar41;
                fVar42 = fVar1 + fVar42;
                pfVar19 = pfVar19 + 8;
                lVar22 = lVar22 + 1;
              } while (uVar7 - uVar18 != (int)lVar22);
            }
            auVar33._0_4_ = auVar84._0_4_ + fVar61 + fVar43 + fVar27;
            auVar33._4_4_ = auVar84._4_4_ + fVar69 + fVar54 + fVar36;
            auVar33._8_4_ = auVar84._8_4_ + fVar70 + fVar55 + fVar37;
            auVar33._12_4_ = auVar84._12_4_ + fVar71 + fVar56 + fVar38;
            auVar33._16_4_ = auVar84._16_4_ + fVar72 + fVar57 + fVar39;
            auVar33._20_4_ = auVar84._20_4_ + fVar73 + fVar58 + fVar40;
            auVar33._24_4_ = auVar84._24_4_ + fVar74 + fVar59 + fVar41;
            auVar33._28_4_ = auVar84._28_4_ + fVar75 + fVar60 + fVar42;
            *(undefined1 (*) [32])
             ((long)local_1b8.data + (long)local_1b8.w * uVar17 * 2 * local_1b8.elemsize) = auVar33;
            uVar17 = uVar17 + 1;
          } while (uVar17 != local_118);
        }
        uVar17 = local_120;
        if ((uint)local_120 != _h) {
          do {
            uVar18 = ((uint)(uVar17 >> 0x1f) & 1) + (int)uVar17;
            lVar22 = (long)(int)(((int)uVar18 >> 1) + ((int)uVar17 - (uVar18 & 0xfffffffe)));
            pfVar19 = (float *)(local_130->w * lVar22 * local_130->elemsize + (long)local_130->data)
            ;
            pfVar20 = (float *)(local_138->w * lVar15 * local_138->elemsize + (long)local_138->data)
            ;
            pfVar26 = (float *)((long)local_140->data + uVar17 * 0x10);
            fVar27 = *pfVar26;
            fVar36 = pfVar26[1];
            fVar37 = pfVar26[2];
            fVar38 = pfVar26[3];
            if ((int)uVar5 < 4) {
              fVar43 = 0.0;
              fVar54 = 0.0;
              fVar55 = 0.0;
              fVar56 = 0.0;
              auVar85 = ZEXT864(0);
              fVar39 = 0.0;
              fVar40 = 0.0;
              fVar41 = 0.0;
              fVar42 = 0.0;
              uVar18 = 0;
            }
            else {
              fVar39 = 0.0;
              fVar40 = 0.0;
              fVar41 = 0.0;
              fVar42 = 0.0;
              iVar21 = 3;
              auVar85 = ZEXT864(0);
              fVar43 = 0.0;
              fVar54 = 0.0;
              fVar55 = 0.0;
              fVar56 = 0.0;
              do {
                fVar57 = *pfVar20;
                fVar58 = pfVar20[1];
                fVar59 = pfVar20[2];
                fVar60 = pfVar20[3];
                fVar27 = fVar57 * *pfVar19 + fVar27;
                fVar36 = fVar57 * pfVar19[1] + fVar36;
                fVar37 = fVar57 * pfVar19[2] + fVar37;
                fVar38 = fVar57 * pfVar19[3] + fVar38;
                fVar43 = fVar58 * pfVar19[4] + fVar43;
                fVar54 = fVar58 * pfVar19[5] + fVar54;
                fVar55 = fVar58 * pfVar19[6] + fVar55;
                fVar56 = fVar58 * pfVar19[7] + fVar56;
                auVar85 = ZEXT1664(CONCAT412(fVar59 * pfVar19[0xb] + auVar85._12_4_,
                                             CONCAT48(fVar59 * pfVar19[10] + auVar85._8_4_,
                                                      CONCAT44(fVar59 * pfVar19[9] + auVar85._4_4_,
                                                               fVar59 * pfVar19[8] + auVar85._0_4_))
                                            ));
                fVar39 = fVar60 * pfVar19[0xc] + fVar39;
                fVar40 = fVar60 * pfVar19[0xd] + fVar40;
                fVar41 = fVar60 * pfVar19[0xe] + fVar41;
                fVar42 = fVar60 * pfVar19[0xf] + fVar42;
                pfVar20 = pfVar20 + 4;
                pfVar19 = pfVar19 + 0x10;
                iVar21 = iVar21 + 4;
                uVar18 = uVar5 & 0xfffffffc;
              } while (iVar21 < (int)uVar5);
            }
            auVar76 = auVar85._0_16_;
            if ((int)uVar18 < (int)uVar5) {
              lVar24 = 0;
              do {
                fVar57 = pfVar20[lVar24];
                fVar27 = fVar57 * *pfVar19 + fVar27;
                fVar36 = fVar57 * pfVar19[1] + fVar36;
                fVar37 = fVar57 * pfVar19[2] + fVar37;
                fVar38 = fVar57 * pfVar19[3] + fVar38;
                pfVar19 = pfVar19 + 4;
                lVar24 = lVar24 + 1;
              } while (uVar5 - uVar18 != (int)lVar24);
            }
            pfVar19 = (float *)(local_80->w * lVar22 * local_80->elemsize + (long)local_80->data);
            pfVar26 = (float *)hidden_state->data;
            uVar18 = 0;
            if (3 < (int)uVar7) {
              iVar21 = 3;
              do {
                fVar57 = *pfVar26;
                fVar58 = pfVar26[1];
                fVar59 = pfVar26[2];
                fVar60 = pfVar26[3];
                fVar27 = fVar57 * *pfVar19 + fVar27;
                fVar36 = fVar57 * pfVar19[1] + fVar36;
                fVar37 = fVar57 * pfVar19[2] + fVar37;
                fVar38 = fVar57 * pfVar19[3] + fVar38;
                fVar43 = fVar58 * pfVar19[4] + fVar43;
                fVar54 = fVar58 * pfVar19[5] + fVar54;
                fVar55 = fVar58 * pfVar19[6] + fVar55;
                fVar56 = fVar58 * pfVar19[7] + fVar56;
                auVar76._0_4_ = fVar59 * pfVar19[8] + auVar85._0_4_;
                auVar76._4_4_ = fVar59 * pfVar19[9] + auVar85._4_4_;
                auVar76._8_4_ = fVar59 * pfVar19[10] + auVar85._8_4_;
                auVar76._12_4_ = fVar59 * pfVar19[0xb] + auVar85._12_4_;
                auVar85 = ZEXT1664(auVar76);
                fVar39 = fVar60 * pfVar19[0xc] + fVar39;
                fVar40 = fVar60 * pfVar19[0xd] + fVar40;
                fVar41 = fVar60 * pfVar19[0xe] + fVar41;
                fVar42 = fVar60 * pfVar19[0xf] + fVar42;
                pfVar26 = pfVar26 + 4;
                pfVar19 = pfVar19 + 0x10;
                iVar21 = iVar21 + 4;
                uVar18 = uVar7 & 0xfffffffc;
              } while (iVar21 < (int)uVar7);
            }
            if ((int)uVar18 < (int)uVar7) {
              lVar22 = 0;
              do {
                fVar57 = pfVar26[lVar22];
                fVar27 = fVar57 * *pfVar19 + fVar27;
                fVar36 = fVar57 * pfVar19[1] + fVar36;
                fVar37 = fVar57 * pfVar19[2] + fVar37;
                fVar38 = fVar57 * pfVar19[3] + fVar38;
                pfVar19 = pfVar19 + 4;
                lVar22 = lVar22 + 1;
              } while (uVar7 - uVar18 != (int)lVar22);
            }
            auVar28._0_4_ = auVar76._0_4_ + fVar43 + fVar39 + fVar27;
            auVar28._4_4_ = auVar76._4_4_ + fVar54 + fVar40 + fVar36;
            auVar28._8_4_ = auVar76._8_4_ + fVar55 + fVar41 + fVar37;
            auVar28._12_4_ = auVar76._12_4_ + fVar56 + fVar42 + fVar38;
            *(undefined1 (*) [16])
             ((long)local_1b8.data + (long)local_1b8.w * uVar17 * local_1b8.elemsize) = auVar28;
            uVar17 = uVar17 + 1;
          } while ((long)uVar17 < (long)uVar14);
        }
        pvVar23 = (void *)(local_78->w * lVar15 * local_78->elemsize + (long)local_78->data);
        local_110 = cell_state->data;
        pvVar8 = hidden_state->data;
        if (0 < (int)local_88) {
          lVar15 = 0;
          do {
            lVar22 = local_1b8.w * lVar15 * local_1b8.elemsize;
            auVar88 = *(undefined1 (*) [16])((long)local_1b8.data + lVar22 + 0x10);
            auVar76 = *(undefined1 (*) [16])((long)local_1b8.data + lVar22 + 0x20);
            auVar28 = *(undefined1 (*) [16])((long)local_1b8.data + lVar22 + 0x30);
            auVar29 = vunpcklps_avx(*(undefined1 (*) [16])((long)local_1b8.data + lVar22),auVar88);
            auVar44 = vunpcklps_avx(auVar76,auVar28);
            auVar30 = vunpckhps_avx(*(undefined1 (*) [16])((long)local_1b8.data + lVar22),auVar88);
            auVar76 = vunpckhps_avx(auVar76,auVar28);
            auVar88 = vmovlhps_avx(auVar29,auVar44);
            local_a8 = vunpckhpd_avx(auVar29,auVar44);
            local_158 = vmovlhps_avx(auVar30,auVar76);
            auVar30 = vunpckhpd_avx(auVar30,auVar76);
            auVar77._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
            auVar77._8_4_ = auVar88._8_4_ ^ 0x80000000;
            auVar77._12_4_ = auVar88._12_4_ ^ 0x80000000;
            auVar121._8_4_ = 0x42b0c0a5;
            auVar121._0_8_ = 0x42b0c0a542b0c0a5;
            auVar121._12_4_ = 0x42b0c0a5;
            auVar88 = vminps_avx(auVar121,auVar77);
            auVar29._8_4_ = 0xc2b0c0a5;
            auVar29._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar29._12_4_ = 0xc2b0c0a5;
            auVar28 = vmaxps_avx(auVar88,auVar29);
            auVar86._0_4_ = auVar28._0_4_ * 1.442695 + 0.5;
            auVar86._4_4_ = auVar28._4_4_ * 1.442695 + 0.5;
            auVar86._8_4_ = auVar28._8_4_ * 1.442695 + 0.5;
            auVar86._12_4_ = auVar28._12_4_ * 1.442695 + 0.5;
            auVar100._0_4_ = (int)auVar86._0_4_;
            auVar100._4_4_ = (int)auVar86._4_4_;
            auVar100._8_4_ = (int)auVar86._8_4_;
            auVar100._12_4_ = (int)auVar86._12_4_;
            auVar76 = vcvtdq2ps_avx(auVar100);
            auVar88 = vcmpps_avx(auVar86,auVar76,1);
            auVar111._8_4_ = 0x3f800000;
            auVar111._0_8_ = 0x3f8000003f800000;
            auVar111._12_4_ = 0x3f800000;
            auVar88 = vandps_avx(auVar88,auVar111);
            auVar88 = vsubps_avx(auVar76,auVar88);
            auVar101._0_4_ = auVar88._0_4_ * 0.6931472;
            auVar101._4_4_ = auVar88._4_4_ * 0.6931472;
            auVar101._8_4_ = auVar88._8_4_ * 0.6931472;
            auVar101._12_4_ = auVar88._12_4_ * 0.6931472;
            auVar76 = vsubps_avx(auVar28,auVar101);
            fVar27 = auVar76._0_4_;
            fVar36 = auVar76._4_4_;
            fVar37 = auVar76._8_4_;
            fVar38 = auVar76._12_4_;
            auVar87._0_4_ = (int)auVar88._0_4_;
            auVar87._4_4_ = (int)auVar88._4_4_;
            auVar87._8_4_ = (int)auVar88._8_4_;
            auVar87._12_4_ = (int)auVar88._12_4_;
            auVar88 = vpslld_avx(auVar87,0x17);
            auVar88 = vpaddd_avx(auVar88,auVar111);
            auVar78._0_4_ =
                 (fVar27 + 1.0 +
                 fVar27 * fVar27 *
                 (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
                   0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5)) * auVar88._0_4_ + 1.0;
            auVar78._4_4_ =
                 (fVar36 + 1.0 +
                 fVar36 * fVar36 *
                 (((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) * fVar36 +
                   0.041665796) * fVar36 + 0.16666666) * fVar36 + 0.5)) * auVar88._4_4_ + 1.0;
            auVar78._8_4_ =
                 (fVar37 + 1.0 +
                 fVar37 * fVar37 *
                 (((((fVar37 * 0.00019875691 + 0.0013981999) * fVar37 + 0.008333452) * fVar37 +
                   0.041665796) * fVar37 + 0.16666666) * fVar37 + 0.5)) * auVar88._8_4_ + 1.0;
            auVar78._12_4_ =
                 (fVar38 + 1.0 +
                 fVar38 * fVar38 *
                 (((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) * fVar38 +
                   0.041665796) * fVar38 + 0.16666666) * fVar38 + 0.5)) * auVar88._12_4_ + 1.0;
            auVar62._0_4_ = auVar30._0_4_ * -2.0;
            auVar62._4_4_ = auVar30._4_4_ * -2.0;
            auVar62._8_4_ = auVar30._8_4_ * -2.0;
            auVar62._12_4_ = auVar30._12_4_ * -2.0;
            auVar88 = vminps_avx(auVar121,auVar62);
            auVar28 = vmaxps_avx(auVar88,auVar29);
            auVar89._0_4_ = auVar28._0_4_ * 1.442695 + 0.5;
            auVar89._4_4_ = auVar28._4_4_ * 1.442695 + 0.5;
            auVar89._8_4_ = auVar28._8_4_ * 1.442695 + 0.5;
            auVar89._12_4_ = auVar28._12_4_ * 1.442695 + 0.5;
            auVar102._0_4_ = (int)auVar89._0_4_;
            auVar102._4_4_ = (int)auVar89._4_4_;
            auVar102._8_4_ = (int)auVar89._8_4_;
            auVar102._12_4_ = (int)auVar89._12_4_;
            auVar76 = vcvtdq2ps_avx(auVar102);
            auVar88 = vcmpps_avx(auVar89,auVar76,1);
            auVar88 = vandps_avx(auVar88,auVar111);
            auVar88 = vsubps_avx(auVar76,auVar88);
            auVar103._0_4_ = auVar88._0_4_ * 0.6931472;
            auVar103._4_4_ = auVar88._4_4_ * 0.6931472;
            auVar103._8_4_ = auVar88._8_4_ * 0.6931472;
            auVar103._12_4_ = auVar88._12_4_ * 0.6931472;
            auVar76 = vsubps_avx(auVar28,auVar103);
            fVar27 = auVar76._0_4_;
            fVar36 = auVar76._4_4_;
            fVar37 = auVar76._8_4_;
            fVar38 = auVar76._12_4_;
            auVar76 = vrcpps_avx(auVar78);
            auVar90._0_4_ = (int)auVar88._0_4_;
            auVar90._4_4_ = (int)auVar88._4_4_;
            auVar90._8_4_ = (int)auVar88._8_4_;
            auVar90._12_4_ = (int)auVar88._12_4_;
            auVar88 = vpslld_avx(auVar90,0x17);
            auVar88 = vpaddd_avx(auVar88,auVar111);
            auVar63._0_4_ =
                 (fVar27 + 1.0 +
                 fVar27 * fVar27 *
                 (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
                   0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5)) * auVar88._0_4_ + 1.0;
            auVar63._4_4_ =
                 (fVar36 + 1.0 +
                 fVar36 * fVar36 *
                 (((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) * fVar36 +
                   0.041665796) * fVar36 + 0.16666666) * fVar36 + 0.5)) * auVar88._4_4_ + 1.0;
            auVar63._8_4_ =
                 (fVar37 + 1.0 +
                 fVar37 * fVar37 *
                 (((((fVar37 * 0.00019875691 + 0.0013981999) * fVar37 + 0.008333452) * fVar37 +
                   0.041665796) * fVar37 + 0.16666666) * fVar37 + 0.5)) * auVar88._8_4_ + 1.0;
            auVar63._12_4_ =
                 (fVar38 + 1.0 +
                 fVar38 * fVar38 *
                 (((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) * fVar38 +
                   0.041665796) * fVar38 + 0.16666666) * fVar38 + 0.5)) * auVar88._12_4_ + 1.0;
            auVar88 = vrcpps_avx(auVar63);
            fVar27 = auVar88._0_4_;
            fVar36 = auVar88._4_4_;
            fVar37 = auVar88._8_4_;
            fVar38 = auVar88._12_4_;
            auVar64._0_4_ = auVar63._0_4_ * (fVar27 + fVar27);
            auVar64._4_4_ = auVar63._4_4_ * (fVar36 + fVar36);
            auVar64._8_4_ = auVar63._8_4_ * (fVar37 + fVar37);
            auVar64._12_4_ = auVar63._12_4_ * (fVar38 + fVar38);
            auVar117._8_4_ = 0x40000000;
            auVar117._0_8_ = 0x4000000040000000;
            auVar117._12_4_ = 0x40000000;
            auVar88 = vsubps_avx(auVar117,auVar64);
            auVar91._0_4_ = fVar27 + fVar27 + -1.0 + fVar27 * auVar88._0_4_;
            auVar91._4_4_ = fVar36 + fVar36 + -1.0 + fVar36 * auVar88._4_4_;
            auVar91._8_4_ = fVar37 + fVar37 + -1.0 + fVar37 * auVar88._8_4_;
            auVar91._12_4_ = fVar38 + fVar38 + -1.0 + fVar38 * auVar88._12_4_;
            fVar43 = auVar91._0_4_ * auVar76._0_4_;
            fVar54 = auVar91._4_4_ * auVar76._4_4_;
            fVar55 = auVar91._8_4_ * auVar76._8_4_;
            fVar56 = auVar91._12_4_ * auVar76._12_4_;
            in_ZMM12 = ZEXT1664(CONCAT412(fVar56,CONCAT48(fVar55,CONCAT44(fVar54,fVar43))));
            auVar79._0_4_ = fVar43 * auVar78._0_4_;
            auVar79._4_4_ = fVar54 * auVar78._4_4_;
            auVar79._8_4_ = fVar55 * auVar78._8_4_;
            auVar79._12_4_ = fVar56 * auVar78._12_4_;
            auVar88 = vsubps_avx(auVar91,auVar79);
            local_168._0_4_ = auVar76._0_4_ * auVar88._0_4_;
            local_168._4_4_ = auVar76._4_4_ * auVar88._4_4_;
            fStack_160 = auVar76._8_4_ * auVar88._8_4_;
            fStack_15c = auVar76._12_4_ * auVar88._12_4_;
            auVar44._0_8_ = local_a8._0_8_ ^ 0x8000000080000000;
            auVar44._8_4_ = local_a8._8_4_ ^ 0x80000000;
            auVar44._12_4_ = local_a8._12_4_ ^ 0x80000000;
            auVar80._8_4_ = 0x42b0c0a5;
            auVar80._0_8_ = 0x42b0c0a542b0c0a5;
            auVar80._12_4_ = 0x42b0c0a5;
            auVar88 = vminps_avx(auVar44,auVar80);
            auVar119._8_4_ = 0xc2b0c0a5;
            auVar119._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar119._12_4_ = 0xc2b0c0a5;
            auVar28 = vmaxps_avx(auVar119,auVar88);
            auVar92._0_4_ = auVar28._0_4_ * 1.442695 + 0.5;
            auVar92._4_4_ = auVar28._4_4_ * 1.442695 + 0.5;
            auVar92._8_4_ = auVar28._8_4_ * 1.442695 + 0.5;
            auVar92._12_4_ = auVar28._12_4_ * 1.442695 + 0.5;
            auVar104._0_4_ = (int)auVar92._0_4_;
            auVar104._4_4_ = (int)auVar92._4_4_;
            auVar104._8_4_ = (int)auVar92._8_4_;
            auVar104._12_4_ = (int)auVar92._12_4_;
            auVar76 = vcvtdq2ps_avx(auVar104);
            auVar88 = vcmpps_avx(auVar92,auVar76,1);
            auVar88 = vandps_avx(auVar88,auVar111);
            auVar88 = vsubps_avx(auVar76,auVar88);
            auVar105._0_4_ = auVar88._0_4_ * 0.6931472;
            auVar105._4_4_ = auVar88._4_4_ * 0.6931472;
            auVar105._8_4_ = auVar88._8_4_ * 0.6931472;
            auVar105._12_4_ = auVar88._12_4_ * 0.6931472;
            auVar76 = vsubps_avx(auVar28,auVar105);
            fVar27 = auVar76._0_4_;
            fVar36 = auVar76._4_4_;
            fVar37 = auVar76._8_4_;
            fVar38 = auVar76._12_4_;
            auVar93._0_4_ = (int)auVar88._0_4_;
            auVar93._4_4_ = (int)auVar88._4_4_;
            auVar93._8_4_ = (int)auVar88._8_4_;
            auVar93._12_4_ = (int)auVar88._12_4_;
            auVar88 = vpslld_avx(auVar93,0x17);
            auVar88 = vpaddd_avx(auVar88,auVar111);
            auVar45._0_4_ =
                 (fVar27 + 1.0 +
                 fVar27 * fVar27 *
                 (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
                   0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5)) * auVar88._0_4_ + 1.0;
            auVar45._4_4_ =
                 (fVar36 + 1.0 +
                 fVar36 * fVar36 *
                 (((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) * fVar36 +
                   0.041665796) * fVar36 + 0.16666666) * fVar36 + 0.5)) * auVar88._4_4_ + 1.0;
            auVar45._8_4_ =
                 (fVar37 + 1.0 +
                 fVar37 * fVar37 *
                 (((((fVar37 * 0.00019875691 + 0.0013981999) * fVar37 + 0.008333452) * fVar37 +
                   0.041665796) * fVar37 + 0.16666666) * fVar37 + 0.5)) * auVar88._8_4_ + 1.0;
            auVar45._12_4_ =
                 (fVar38 + 1.0 +
                 fVar38 * fVar38 *
                 (((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) * fVar38 +
                   0.041665796) * fVar38 + 0.16666666) * fVar38 + 0.5)) * auVar88._12_4_ + 1.0;
            auVar29 = vrcpps_avx(auVar45);
            auVar88 = *(undefined1 (*) [16])((long)local_110 + lVar15 * 4);
            fVar36 = auVar88._0_4_ * auVar29._0_4_;
            fVar38 = auVar88._4_4_ * auVar29._4_4_;
            fVar40 = auVar88._8_4_ * auVar29._8_4_;
            fVar42 = auVar88._12_4_ * auVar29._12_4_;
            auVar46._0_4_ = auVar45._0_4_ * fVar36;
            auVar46._4_4_ = auVar45._4_4_ * fVar38;
            auVar46._8_4_ = auVar45._8_4_ * fVar40;
            auVar46._12_4_ = auVar45._12_4_ * fVar42;
            auVar44 = vsubps_avx(auVar88,auVar46);
            auVar30._0_8_ = local_158._0_8_ ^ 0x8000000080000000;
            auVar30._8_4_ = local_158._8_4_ ^ 0x80000000;
            auVar30._12_4_ = local_158._12_4_ ^ 0x80000000;
            auVar88 = vminps_avx(auVar30,auVar80);
            auVar28 = vmaxps_avx(auVar119,auVar88);
            auVar94._0_4_ = auVar28._0_4_ * 1.442695 + 0.5;
            auVar94._4_4_ = auVar28._4_4_ * 1.442695 + 0.5;
            auVar94._8_4_ = auVar28._8_4_ * 1.442695 + 0.5;
            auVar94._12_4_ = auVar28._12_4_ * 1.442695 + 0.5;
            auVar106._0_4_ = (int)auVar94._0_4_;
            auVar106._4_4_ = (int)auVar94._4_4_;
            auVar106._8_4_ = (int)auVar94._8_4_;
            auVar106._12_4_ = (int)auVar94._12_4_;
            auVar76 = vcvtdq2ps_avx(auVar106);
            auVar88 = vcmpps_avx(auVar94,auVar76,1);
            auVar88 = vandps_avx(auVar88,auVar111);
            auVar88 = vsubps_avx(auVar76,auVar88);
            auVar107._0_4_ = auVar88._0_4_ * 0.6931472;
            auVar107._4_4_ = auVar88._4_4_ * 0.6931472;
            auVar107._8_4_ = auVar88._8_4_ * 0.6931472;
            auVar107._12_4_ = auVar88._12_4_ * 0.6931472;
            auVar76 = vsubps_avx(auVar28,auVar107);
            fVar27 = auVar76._0_4_;
            fVar37 = auVar76._4_4_;
            fVar39 = auVar76._8_4_;
            fVar41 = auVar76._12_4_;
            auVar95._0_4_ = (int)auVar88._0_4_;
            auVar95._4_4_ = (int)auVar88._4_4_;
            auVar95._8_4_ = (int)auVar88._8_4_;
            auVar95._12_4_ = (int)auVar88._12_4_;
            auVar88 = vpslld_avx(auVar95,0x17);
            auVar30 = vpaddd_avx(auVar88,auVar111);
            auVar31._0_4_ = fVar43 + fVar36 + auVar29._0_4_ * auVar44._0_4_ + (float)local_168._0_4_
            ;
            auVar31._4_4_ = fVar54 + fVar38 + auVar29._4_4_ * auVar44._4_4_ + (float)local_168._4_4_
            ;
            auVar31._8_4_ = fVar55 + fVar40 + auVar29._8_4_ * auVar44._8_4_ + fStack_160;
            auVar31._12_4_ = fVar56 + fVar42 + auVar29._12_4_ * auVar44._12_4_ + fStack_15c;
            auVar47._0_4_ = auVar31._0_4_ * -2.0;
            auVar47._4_4_ = auVar31._4_4_ * -2.0;
            auVar47._8_4_ = auVar31._8_4_ * -2.0;
            auVar47._12_4_ = auVar31._12_4_ * -2.0;
            auVar88 = vminps_avx(auVar47,auVar80);
            auVar65._8_4_ = 0xc2b0c0a5;
            auVar65._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar65._12_4_ = 0xc2b0c0a5;
            auVar28 = vmaxps_avx(auVar88,auVar65);
            auVar66._0_4_ = auVar28._0_4_ * 1.442695 + 0.5;
            auVar66._4_4_ = auVar28._4_4_ * 1.442695 + 0.5;
            auVar66._8_4_ = auVar28._8_4_ * 1.442695 + 0.5;
            auVar66._12_4_ = auVar28._12_4_ * 1.442695 + 0.5;
            auVar81._0_4_ = (int)auVar66._0_4_;
            auVar81._4_4_ = (int)auVar66._4_4_;
            auVar81._8_4_ = (int)auVar66._8_4_;
            auVar81._12_4_ = (int)auVar66._12_4_;
            auVar76 = vcvtdq2ps_avx(auVar81);
            auVar88 = vcmpps_avx(auVar66,auVar76,1);
            auVar88 = vandps_avx(auVar88,auVar111);
            auVar88 = vsubps_avx(auVar76,auVar88);
            auVar82._0_4_ = auVar88._0_4_ * 0.6931472;
            auVar82._4_4_ = auVar88._4_4_ * 0.6931472;
            auVar82._8_4_ = auVar88._8_4_ * 0.6931472;
            auVar82._12_4_ = auVar88._12_4_ * 0.6931472;
            auVar76 = vsubps_avx(auVar28,auVar82);
            fVar36 = auVar76._0_4_;
            fVar38 = auVar76._4_4_;
            fVar40 = auVar76._8_4_;
            fVar42 = auVar76._12_4_;
            auVar96._0_4_ =
                 (fVar27 + 1.0 +
                 fVar27 * fVar27 *
                 (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
                   0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5)) * auVar30._0_4_ + 1.0;
            auVar96._4_4_ =
                 (fVar37 + 1.0 +
                 fVar37 * fVar37 *
                 (((((fVar37 * 0.00019875691 + 0.0013981999) * fVar37 + 0.008333452) * fVar37 +
                   0.041665796) * fVar37 + 0.16666666) * fVar37 + 0.5)) * auVar30._4_4_ + 1.0;
            auVar96._8_4_ =
                 (fVar39 + 1.0 +
                 fVar39 * fVar39 *
                 (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) * fVar39 +
                   0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5)) * auVar30._8_4_ + 1.0;
            auVar96._12_4_ =
                 (fVar41 + 1.0 +
                 fVar41 * fVar41 *
                 (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) * fVar41 +
                   0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5)) * auVar30._12_4_ + 1.0;
            auVar67._0_4_ = (int)auVar88._0_4_;
            auVar67._4_4_ = (int)auVar88._4_4_;
            auVar67._8_4_ = (int)auVar88._8_4_;
            auVar67._12_4_ = (int)auVar88._12_4_;
            auVar88 = vpslld_avx(auVar67,0x17);
            auVar88 = vpaddd_avx(auVar88,auVar111);
            auVar48._0_4_ =
                 (fVar36 + 1.0 +
                 fVar36 * fVar36 *
                 (((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) * fVar36 +
                   0.041665796) * fVar36 + 0.16666666) * fVar36 + 0.5)) * auVar88._0_4_ + 1.0;
            auVar48._4_4_ =
                 (fVar38 + 1.0 +
                 fVar38 * fVar38 *
                 (((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) * fVar38 +
                   0.041665796) * fVar38 + 0.16666666) * fVar38 + 0.5)) * auVar88._4_4_ + 1.0;
            auVar48._8_4_ =
                 (fVar40 + 1.0 +
                 fVar40 * fVar40 *
                 (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40 +
                   0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5)) * auVar88._8_4_ + 1.0;
            auVar48._12_4_ =
                 (fVar42 + 1.0 +
                 fVar42 * fVar42 *
                 (((((fVar42 * 0.00019875691 + 0.0013981999) * fVar42 + 0.008333452) * fVar42 +
                   0.041665796) * fVar42 + 0.16666666) * fVar42 + 0.5)) * auVar88._12_4_ + 1.0;
            auVar88 = vrcpps_avx(auVar48);
            fVar27 = auVar88._0_4_;
            fVar36 = auVar88._4_4_;
            fVar37 = auVar88._8_4_;
            fVar38 = auVar88._12_4_;
            auVar49._0_4_ = auVar48._0_4_ * (fVar27 + fVar27);
            auVar49._4_4_ = auVar48._4_4_ * (fVar36 + fVar36);
            auVar49._8_4_ = auVar48._8_4_ * (fVar37 + fVar37);
            auVar49._12_4_ = auVar48._12_4_ * (fVar38 + fVar38);
            auVar108._8_4_ = 0x40000000;
            auVar108._0_8_ = 0x4000000040000000;
            auVar108._12_4_ = 0x40000000;
            auVar76 = vsubps_avx(auVar108,auVar49);
            auVar88 = vrcpps_avx(auVar96);
            auVar50._0_4_ = fVar27 + fVar27 + -1.0 + fVar27 * auVar76._0_4_;
            auVar50._4_4_ = fVar36 + fVar36 + -1.0 + fVar36 * auVar76._4_4_;
            auVar50._8_4_ = fVar37 + fVar37 + -1.0 + fVar37 * auVar76._8_4_;
            auVar50._12_4_ = fVar38 + fVar38 + -1.0 + fVar38 * auVar76._12_4_;
            fVar27 = auVar50._0_4_ * auVar88._0_4_;
            fVar36 = auVar50._4_4_ * auVar88._4_4_;
            fVar37 = auVar50._8_4_ * auVar88._8_4_;
            fVar38 = auVar50._12_4_ * auVar88._12_4_;
            auVar97._0_4_ = auVar96._0_4_ * fVar27;
            auVar97._4_4_ = auVar96._4_4_ * fVar36;
            auVar97._8_4_ = auVar96._8_4_ * fVar37;
            auVar97._12_4_ = auVar96._12_4_ * fVar38;
            auVar76 = vsubps_avx(auVar50,auVar97);
            auVar51._0_4_ = fVar27 + auVar88._0_4_ * auVar76._0_4_;
            auVar51._4_4_ = fVar36 + auVar88._4_4_ * auVar76._4_4_;
            auVar51._8_4_ = fVar37 + auVar88._8_4_ * auVar76._8_4_;
            auVar51._12_4_ = fVar38 + auVar88._12_4_ * auVar76._12_4_;
            *(undefined1 (*) [16])((long)local_110 + lVar15 * 4) = auVar31;
            pvVar16 = (void *)local_108._0_8_;
            if (uVar7 == _h) {
              *(undefined1 (*) [16])((long)pvVar8 + lVar15 * 4) = auVar51;
              pvVar16 = pvVar23;
            }
            *(undefined1 (*) [16])((long)pvVar16 + lVar15 * 4) = auVar51;
            lVar15 = lVar15 + 4;
          } while (local_90 != lVar15);
        }
        auVar88 = in_ZMM12._0_16_;
        local_60 = (void *)local_108._0_8_;
        local_70 = uVar25;
        if ((uint)local_128 != _h) {
          local_68 = (long)local_1b8.w * local_1b8.elemsize;
          pfVar26 = (float *)((long)local_1b8.data + local_68 * local_128 + 0xc);
          uVar25 = local_128;
          do {
            local_b8 = ZEXT416((uint)pfVar26[-2]);
            _local_168 = ZEXT416((uint)pfVar26[-1]);
            in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
            local_158._0_4_ = *pfVar26;
            fVar27 = expf(-pfVar26[-3]);
            local_a8._0_4_ = fVar27 + 1.0;
            fVar27 = expf(-(float)local_b8._0_4_);
            local_b8._0_4_ = fVar27 + 1.0;
            fVar27 = expf(-(float)local_168._0_4_);
            local_168._0_4_ = fVar27;
            fVar27 = tanhf((float)local_158._0_4_);
            pvVar16 = local_110;
            local_158._0_4_ =
                 *(float *)((long)local_110 + uVar25 * 4) / (float)local_b8._0_4_ +
                 fVar27 / (float)local_a8._0_4_;
            fVar27 = tanhf((float)local_158._0_4_);
            auVar88 = in_ZMM12._0_16_;
            fVar27 = fVar27 / ((float)local_168._0_4_ + 1.0);
            *(undefined4 *)((long)pvVar16 + uVar25 * 4) = local_158._0_4_;
            pvVar16 = local_60;
            if (uVar7 == _h) {
              *(float *)((long)pvVar8 + uVar25 * 4) = fVar27;
              pvVar16 = pvVar23;
            }
            *(float *)((long)pvVar16 + uVar25 * 4) = fVar27;
            uVar25 = uVar25 + 1;
            pfVar26 = (float *)((long)pfVar26 + local_68);
          } while ((long)uVar25 < (long)uVar14);
        }
        auVar33 = _DAT_005964a0;
        auVar84 = _DAT_00596480;
        auVar88 = vpcmpeqd_avx(auVar88,auVar88);
        in_ZMM12 = ZEXT1664(auVar88);
        if (0 < (int)uVar7 && uVar7 != _h) {
          pvVar16 = weight_hr->data;
          iVar21 = weight_hr->w;
          sVar9 = weight_hr->elemsize;
          uVar25 = 0;
          do {
            if ((int)_h < 1) {
              uVar120 = 0;
            }
            else {
              uVar17 = 0;
              auVar85 = ZEXT1664((undefined1  [16])0x0);
              do {
                auVar35 = auVar85;
                auVar52._8_8_ = 0;
                auVar52._0_8_ = uVar17;
                auVar76 = vpshufd_avx(auVar52,0x44);
                auVar68._16_16_ = auVar76;
                auVar68._0_16_ = auVar76;
                auVar10 = vorps_avx(auVar84,auVar68);
                auVar68 = vorps_avx(auVar33,auVar68);
                auVar109._0_8_ = local_58._16_8_ ^ 0x8000000000000000;
                auVar109._8_4_ = local_58._24_4_;
                auVar109._12_4_ = local_58._28_4_ ^ 0x80000000;
                auVar98._0_8_ = auVar68._16_8_ ^ 0x8000000000000000;
                auVar98._8_4_ = auVar68._24_4_;
                auVar98._12_4_ = auVar68._28_4_ ^ 0x80000000;
                auVar30 = vpcmpgtq_avx(auVar98,auVar109);
                uVar12 = local_58._0_8_;
                auVar110._0_8_ = uVar12 ^ 0x8000000000000000;
                uVar120 = local_58._8_4_;
                auVar110._8_4_ = uVar120;
                uVar18 = local_58._12_4_;
                auVar110._12_4_ = uVar18 ^ 0x80000000;
                auVar112._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
                auVar83._8_4_ = auVar68._8_4_;
                auVar112._8_4_ = auVar83._8_4_;
                auVar112._12_4_ = auVar68._12_4_ ^ 0x80000000;
                auVar76 = vpcmpgtq_avx(auVar112,auVar110);
                auVar76 = vpackssdw_avx(auVar76,auVar30);
                auVar113._0_8_ = auVar10._16_8_ ^ 0x8000000000000000;
                auVar113._8_4_ = auVar10._24_4_;
                auVar113._12_4_ = auVar10._28_4_ ^ 0x80000000;
                auVar29 = vpcmpgtq_avx(auVar113,auVar109);
                auVar114._0_8_ = uVar12 ^ 0x8000000000000000;
                auVar114._8_4_ = uVar120;
                auVar114._12_4_ = uVar18 ^ 0x80000000;
                auVar118._0_8_ = auVar10._0_8_ ^ 0x8000000000000000;
                auVar53._8_4_ = auVar10._8_4_;
                auVar118._8_4_ = auVar53._8_4_;
                auVar118._12_4_ = auVar10._12_4_ ^ 0x80000000;
                auVar28 = vpcmpgtq_avx(auVar118,auVar114);
                auVar28 = vpackssdw_avx(auVar28,auVar29);
                auVar76 = vpackssdw_avx(auVar88 ^ auVar28,auVar88 ^ auVar76);
                auVar28 = vpmovsxwd_avx(auVar76);
                auVar76 = vpunpckhwd_avx(auVar76,auVar76);
                auVar116._16_16_ = auVar76;
                auVar116._0_16_ = auVar28;
                auVar11 = vmaskmovps_avx(auVar116,*(undefined1 (*) [32])
                                                   (local_108._0_8_ + uVar17 * 4));
                auVar116 = vmaskmovps_avx(auVar116,*(undefined1 (*) [32])
                                                    ((long)pvVar16 + uVar17 * 4));
                auVar32._0_4_ = auVar11._0_4_ * auVar116._0_4_ + auVar35._0_4_;
                auVar32._4_4_ = auVar11._4_4_ * auVar116._4_4_ + auVar35._4_4_;
                auVar32._8_4_ = auVar11._8_4_ * auVar116._8_4_ + auVar35._8_4_;
                auVar32._12_4_ = auVar11._12_4_ * auVar116._12_4_ + auVar35._12_4_;
                auVar34._16_4_ = auVar11._16_4_ * auVar116._16_4_ + auVar35._16_4_;
                auVar34._0_16_ = auVar32;
                auVar34._20_4_ = auVar11._20_4_ * auVar116._20_4_ + auVar35._20_4_;
                auVar34._24_4_ = auVar11._24_4_ * auVar116._24_4_ + auVar35._24_4_;
                auVar34._28_4_ = auVar116._28_4_ + auVar35._28_4_;
                uVar17 = uVar17 + 8;
                auVar85 = ZEXT3264(auVar34);
              } while (local_98 != uVar17);
              auVar115._0_8_ = uVar12 ^ 0x8000000000000000;
              auVar115._8_4_ = uVar120;
              auVar115._12_4_ = uVar18 ^ 0x80000000;
              auVar83._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
              auVar83._12_4_ = auVar68._12_4_ ^ 0x80000000;
              auVar76 = vpcmpgtq_avx(auVar83,auVar115);
              auVar28 = vpackssdw_avx(auVar76,auVar30);
              auVar99._0_8_ = uVar12 ^ 0x8000000000000000;
              auVar99._8_4_ = uVar120;
              auVar99._12_4_ = uVar18 ^ 0x80000000;
              auVar53._0_8_ = auVar10._0_8_ ^ 0x8000000000000000;
              auVar53._12_4_ = auVar10._12_4_ ^ 0x80000000;
              auVar76 = vpcmpgtq_avx(auVar53,auVar99);
              auVar76 = vpackssdw_avx(auVar76,auVar29);
              auVar76 = vblendvps_avx(auVar35._0_16_,auVar32,auVar88 ^ auVar76);
              auVar28 = vblendvps_avx(auVar35._16_16_,auVar34._16_16_,auVar88 ^ auVar28);
              auVar76 = vhaddps_avx(auVar28,auVar76);
              auVar76 = vhaddps_avx(auVar76,auVar76);
              auVar76 = vhaddps_avx(auVar76,auVar76);
              uVar120 = auVar76._0_4_;
            }
            *(undefined4 *)((long)pvVar23 + uVar25 * 4) = uVar120;
            *(undefined4 *)((long)pvVar8 + uVar25 * 4) = uVar120;
            uVar25 = uVar25 + 1;
            pvVar16 = (void *)((long)pvVar16 + (long)iVar21 * sVar9);
          } while (uVar25 != uVar7);
        }
        uVar18 = (int)local_70 + 1;
        uVar25 = (ulong)uVar18;
      } while (uVar18 != uVar6);
      iVar21 = 0;
    }
  }
  else {
    Mat::create((Mat *)local_108,_h,4,opt->workspace_allocator);
    iVar21 = -100;
    if (((void *)local_108._0_8_ != (void *)0x0) && ((long)local_d0 * local_c8 != 0))
    goto LAB_0039abeb;
  }
  piVar13 = (int *)CONCAT44(local_108._12_4_,local_108._8_4_);
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if (local_e8 == (Allocator *)0x0) {
        if ((void *)local_108._0_8_ != (void *)0x0) {
          free((void *)local_108._0_8_);
        }
      }
      else {
        (*local_e8->_vptr_Allocator[3])();
      }
    }
  }
  local_c8 = 0;
  local_108._0_8_ = (void *)0x0;
  local_108._8_4_ = 0;
  local_108._12_4_ = 0;
  local_108._16_12_ = SUB1612((undefined1  [16])0x0,4);
  iStack_e0 = 0;
  iStack_dc = 0;
  uStack_d8._0_4_ = 0;
  uStack_d8._4_4_ = 0;
  local_d0 = 0;
LAB_0039b936:
  piVar13 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if (local_1b8.allocator == (Allocator *)0x0) {
        if (local_1b8.data != (void *)0x0) {
          free(local_1b8.data);
        }
      }
      else {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar21;
}

Assistant:

static int lstm(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, const Mat& weight_hr, Mat& hidden_state, Mat& cell_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;
    int hidden_size = cell_state.w;

    // 4 x hidden_size
    Mat gates(4, hidden_size, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    Mat tmp_hidden_state;
    if (num_output != hidden_size)
    {
        tmp_hidden_state.create(hidden_size, 4u, opt.workspace_allocator);
        if (tmp_hidden_state.empty())
            return -100;
    }

    // unroll
    for (int t = 0; t < T; t++)
    {
        // clip hidden by continuation indicator
        // h_cont_{t-1} = cont_t * h_{t-1}
        // h_cont_{t-1} = h_{t-1} if cont_t == 1
        //                0       otherwise
        // calculate hidden
        // gate_input_t := W_hc * h_conted_{t-1} + W_xc * x_t + b_c

        int ti = reverse ? T - 1 - t : t;

#if __AVX__
        int nn_hidden_size = hidden_size >> 1;
        int remain_hidden_size_start = nn_hidden_size << 1;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int qq = 0; qq < nn_hidden_size; qq++)
        {
            int q = qq * 2;

            const float* bias_c_IFOG = (const float*)bias_c + q * 4;

            // gate I F O G
            const float* weight_xc_IFOG = weight_xc.row(q / 2);
            const float* weight_hc_IFOG = weight_hc.row(q / 2);

            __m256 _IFOG = _mm256_loadu_ps(bias_c_IFOG);
            __m256 _sum1 = _mm256_setzero_ps();
            __m256 _sum2 = _mm256_setzero_ps();
            __m256 _sum3 = _mm256_setzero_ps();

            const float* x = bottom_blob.row(ti);

            int i = 0;
            for (; i + 3 < size; i += 4)
            {
                __m256 _xi0 = _mm256_broadcast_ss(x);
                __m256 _xi1 = _mm256_broadcast_ss(x + 1);
                __m256 _xi2 = _mm256_broadcast_ss(x + 2);
                __m256 _xi3 = _mm256_broadcast_ss(x + 3);
                __m256 _weight_xc_IFOG0 = _mm256_loadu_ps(weight_xc_IFOG);
                __m256 _weight_xc_IFOG1 = _mm256_loadu_ps(weight_xc_IFOG + 8);
                __m256 _weight_xc_IFOG2 = _mm256_loadu_ps(weight_xc_IFOG + 16);
                __m256 _weight_xc_IFOG3 = _mm256_loadu_ps(weight_xc_IFOG + 24);
                _IFOG = _mm256_comp_fmadd_ps(_weight_xc_IFOG0, _xi0, _IFOG);
                _sum1 = _mm256_comp_fmadd_ps(_weight_xc_IFOG1, _xi1, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_weight_xc_IFOG2, _xi2, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_weight_xc_IFOG3, _xi3, _sum3);

                x += 4;
                weight_xc_IFOG += 32;
            }
            for (; i < size; i++)
            {
                __m256 _xi = _mm256_broadcast_ss(x);
                __m256 _weight_xc_IFOG = _mm256_loadu_ps(weight_xc_IFOG);
                _IFOG = _mm256_comp_fmadd_ps(_weight_xc_IFOG, _xi, _IFOG);

                x += 1;
                weight_xc_IFOG += 8;
            }

            const float* hidden_ptr = hidden_state;

            i = 0;
            for (; i + 3 < num_output; i += 4)
            {
                __m256 _h_cont0 = _mm256_broadcast_ss(hidden_ptr);
                __m256 _h_cont1 = _mm256_broadcast_ss(hidden_ptr + 1);
                __m256 _h_cont2 = _mm256_broadcast_ss(hidden_ptr + 2);
                __m256 _h_cont3 = _mm256_broadcast_ss(hidden_ptr + 3);
                __m256 _weight_hc_IFOG0 = _mm256_loadu_ps(weight_hc_IFOG);
                __m256 _weight_hc_IFOG1 = _mm256_loadu_ps(weight_hc_IFOG + 8);
                __m256 _weight_hc_IFOG2 = _mm256_loadu_ps(weight_hc_IFOG + 16);
                __m256 _weight_hc_IFOG3 = _mm256_loadu_ps(weight_hc_IFOG + 24);
                _IFOG = _mm256_comp_fmadd_ps(_weight_hc_IFOG0, _h_cont0, _IFOG);
                _sum1 = _mm256_comp_fmadd_ps(_weight_hc_IFOG1, _h_cont1, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_weight_hc_IFOG2, _h_cont2, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_weight_hc_IFOG3, _h_cont3, _sum3);

                hidden_ptr += 4;
                weight_hc_IFOG += 32;
            }
            for (; i < num_output; i++)
            {
                __m256 _h_cont = _mm256_broadcast_ss(hidden_ptr);
                __m256 _weight_hc_IFOG = _mm256_loadu_ps(weight_hc_IFOG);
                _IFOG = _mm256_comp_fmadd_ps(_weight_hc_IFOG, _h_cont, _IFOG);

                hidden_ptr += 1;
                weight_hc_IFOG += 8;
            }

            float* gates_data = gates.row(q);

            _IFOG = _mm256_add_ps(_IFOG, _sum1);
            _sum2 = _mm256_add_ps(_sum2, _sum3);
            _IFOG = _mm256_add_ps(_IFOG, _sum2);

            _mm256_storeu_ps(gates_data, _IFOG);
        }
#else
        int nn_hidden_size = 0;
        int remain_hidden_size_start = 0;
#endif // __AVX__

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = remain_hidden_size_start; q < hidden_size; q++)
        {
            const float* bias_c_IFOG = (const float*)bias_c + q * 4;

            // gate I F O G
#if __AVX__
            const float* weight_xc_IFOG = weight_xc.row(q / 2 + q % 2);
            const float* weight_hc_IFOG = weight_hc.row(q / 2 + q % 2);
#else
            const float* weight_xc_IFOG = weight_xc.row(q);
            const float* weight_hc_IFOG = weight_hc.row(q);
#endif

#if __SSE2__
            __m128 _IFOG = _mm_loadu_ps(bias_c_IFOG);
            __m128 _sum1 = _mm_setzero_ps();
            __m128 _sum2 = _mm_setzero_ps();
            __m128 _sum3 = _mm_setzero_ps();
#else  // __SSE2__
            float I = bias_c_IFOG[0];
            float F = bias_c_IFOG[1];
            float O = bias_c_IFOG[2];
            float G = bias_c_IFOG[3];
#endif // __SSE2__

            const float* x = bottom_blob.row(ti);

            int i = 0;
#if __SSE2__
            for (; i + 3 < size; i += 4)
            {
                __m128 _xi0 = _mm_load1_ps(x);
                __m128 _xi1 = _mm_load1_ps(x + 1);
                __m128 _xi2 = _mm_load1_ps(x + 2);
                __m128 _xi3 = _mm_load1_ps(x + 3);
                __m128 _weight_xc_IFOG0 = _mm_loadu_ps(weight_xc_IFOG);
                __m128 _weight_xc_IFOG1 = _mm_loadu_ps(weight_xc_IFOG + 4);
                __m128 _weight_xc_IFOG2 = _mm_loadu_ps(weight_xc_IFOG + 8);
                __m128 _weight_xc_IFOG3 = _mm_loadu_ps(weight_xc_IFOG + 12);
                _IFOG = _mm_comp_fmadd_ps(_weight_xc_IFOG0, _xi0, _IFOG);
                _sum1 = _mm_comp_fmadd_ps(_weight_xc_IFOG1, _xi1, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_weight_xc_IFOG2, _xi2, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_weight_xc_IFOG3, _xi3, _sum3);

                x += 4;
                weight_xc_IFOG += 16;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
#if __SSE2__
                __m128 _xi = _mm_load1_ps(x);
                __m128 _weight_xc_IFOG = _mm_loadu_ps(weight_xc_IFOG);
                _IFOG = _mm_comp_fmadd_ps(_weight_xc_IFOG, _xi, _IFOG);
#else  // __SSE2__
                float xi = x[0];
                I += xi * weight_xc_IFOG[0];
                F += xi * weight_xc_IFOG[1];
                O += xi * weight_xc_IFOG[2];
                G += xi * weight_xc_IFOG[3];
#endif // __SSE2__

                x += 1;
                weight_xc_IFOG += 4;
            }

            const float* hidden_ptr = hidden_state;

            i = 0;
#if __SSE2__
            for (; i + 3 < num_output; i += 4)
            {
                __m128 _h_cont0 = _mm_load1_ps(hidden_ptr);
                __m128 _h_cont1 = _mm_load1_ps(hidden_ptr + 1);
                __m128 _h_cont2 = _mm_load1_ps(hidden_ptr + 2);
                __m128 _h_cont3 = _mm_load1_ps(hidden_ptr + 3);
                __m128 _weight_hc_IFOG0 = _mm_loadu_ps(weight_hc_IFOG);
                __m128 _weight_hc_IFOG1 = _mm_loadu_ps(weight_hc_IFOG + 4);
                __m128 _weight_hc_IFOG2 = _mm_loadu_ps(weight_hc_IFOG + 8);
                __m128 _weight_hc_IFOG3 = _mm_loadu_ps(weight_hc_IFOG + 12);
                _IFOG = _mm_comp_fmadd_ps(_weight_hc_IFOG0, _h_cont0, _IFOG);
                _sum1 = _mm_comp_fmadd_ps(_weight_hc_IFOG1, _h_cont1, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_weight_hc_IFOG2, _h_cont2, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_weight_hc_IFOG3, _h_cont3, _sum3);

                hidden_ptr += 4;
                weight_hc_IFOG += 16;
            }
#endif // __SSE2__
            for (; i < num_output; i++)
            {
#if __SSE2__
                __m128 _h_cont = _mm_load1_ps(hidden_ptr);
                __m128 _weight_hc_IFOG = _mm_loadu_ps(weight_hc_IFOG);
                _IFOG = _mm_comp_fmadd_ps(_weight_hc_IFOG, _h_cont, _IFOG);
#else  // __SSE2__
                float h_cont = hidden_ptr[0];
                I += h_cont * weight_hc_IFOG[0];
                F += h_cont * weight_hc_IFOG[1];
                O += h_cont * weight_hc_IFOG[2];
                G += h_cont * weight_hc_IFOG[3];
#endif // __SSE2__

                hidden_ptr += 1;
                weight_hc_IFOG += 4;
            }

            float* gates_data = gates.row(q);

#if __SSE2__
            _IFOG = _mm_add_ps(_IFOG, _sum1);
            _sum2 = _mm_add_ps(_sum2, _sum3);
            _IFOG = _mm_add_ps(_IFOG, _sum2);

            _mm_storeu_ps(gates_data, _IFOG);
#else  // __SSE2__
            gates_data[0] = I;
            gates_data[1] = F;
            gates_data[2] = O;
            gates_data[3] = G;
#endif // __SSE2__
        }

        // lstm unit
        // sigmoid(I)
        // sigmoid(F)
        // sigmoid(O)
        // tanh(G)
        // c_t := f_t .* c_{t-1} + i_t .* g_t
        // h_t := o_t .* tanh[c_t]
        float* output_data = top_blob.row(ti);

        float* cell_ptr = cell_state;
        float* hidden_ptr = hidden_state;
        float* tmp_hidden_ptr = tmp_hidden_state;

#if __SSE2__
        nn_hidden_size = hidden_size >> 2;
        remain_hidden_size_start = nn_hidden_size << 2;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int qq = 0; qq < nn_hidden_size; qq++)
        {
            int q = qq * 4;

            const float* gates_data = gates.row(q);

            __m128 _IFOG_4x4_0 = _mm_loadu_ps(gates_data);
            __m128 _IFOG_4x4_1 = _mm_loadu_ps(gates_data + 4);
            __m128 _IFOG_4x4_2 = _mm_loadu_ps(gates_data + 8);
            __m128 _IFOG_4x4_3 = _mm_loadu_ps(gates_data + 12);

            _MM_TRANSPOSE4_PS(_IFOG_4x4_0, _IFOG_4x4_1, _IFOG_4x4_2, _IFOG_4x4_3);

            __m128 _I = sigmoid_sse(_IFOG_4x4_0);
            __m128 _F = sigmoid_sse(_IFOG_4x4_1);
            __m128 _O = sigmoid_sse(_IFOG_4x4_2);
            __m128 _G = tanh_sse(_IFOG_4x4_3);

            __m128 _cell2 = _mm_add_ps(_mm_mul_ps(_F, _mm_loadu_ps(cell_ptr + q)), _mm_mul_ps(_I, _G));
            __m128 _H = _mm_mul_ps(_O, tanh_sse(_cell2));

            _mm_storeu_ps(cell_ptr + q, _cell2);

            if (num_output == hidden_size)
            {
                _mm_storeu_ps(hidden_ptr + q, _H);
                _mm_storeu_ps(output_data + q, _H);
            }
            else
            {
                _mm_storeu_ps(tmp_hidden_ptr + q, _H);
            }
        }
#else  // __SSE2__
        remain_hidden_size_start = 0;
#endif // __SSE2__
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = remain_hidden_size_start; q < hidden_size; q++)
        {
            const float* gates_data = gates.row(q);

            float I = gates_data[0];
            float F = gates_data[1];
            float O = gates_data[2];
            float G = gates_data[3];

            I = 1.f / (1.f + expf(-I));
            F = 1.f / (1.f + expf(-F));
            O = 1.f / (1.f + expf(-O));
            G = tanhf(G);

            float cell2 = F * cell_ptr[q] + I * G;
            float H = O * tanhf(cell2);

            cell_ptr[q] = cell2;
            if (num_output == hidden_size)
            {
                hidden_ptr[q] = H;
                output_data[q] = H;
            }
            else
            {
                tmp_hidden_ptr[q] = H;
            }
        }

        if (num_output != hidden_size)
        {
            // int nn_num_output = num_output >> 2;
            // int remain_num_output_start = nn_num_output << 2;
            // #pragma omp parallel for num_threads(opt.num_threads)
            // for (int qq = 0; qq < nn_num_output; qq++)
            // {
            //     int q = qq * 4;
            //
            // }
            int remain_num_output_start = 0;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = remain_num_output_start; q < num_output; q++)
            {
                const float* hr = weight_hr.row(q);
                const float* tmp_hidden_ptr = tmp_hidden_state;

                float H = 0;
                for (int i = 0; i < hidden_size; i++)
                {
                    H += tmp_hidden_ptr[i] * hr[i];
                }

                output_data[q] = H;
                hidden_ptr[q] = H;
            }
        }
    }

    return 0;
}